

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfile.c
# Opt level: O3

void bf_write_buffer(bfile_t *bfile)

{
  size_t sVar1;
  size_t sVar2;
  ulong uVar3;
  ulong uVar4;
  
  sVar2 = bfile->pos;
  uVar4 = sVar2 - bfile->ipos;
  if (uVar4 == 0) {
    uVar3 = 0;
  }
  else {
    uVar3 = 0;
    do {
      sVar1 = fwrite(bfile->buffer + uVar3 + bfile->ipos % (ulong)bfile->buffer_size,1,uVar4 - uVar3
                     ,(FILE *)bfile->file);
      if (sVar1 == 0) {
        bf_write_buffer_cold_1();
      }
      else {
        uVar3 = uVar3 + sVar1;
      }
    } while (uVar3 < uVar4);
    sVar2 = bfile->ipos;
  }
  bfile->ipos = sVar2 + uVar3;
  return;
}

Assistant:

static
void
bf_write_buffer(
    bfile_t * bfile )
{
    size_t written, towrite;

    assert( bfile != NULL );
    assert( bfile->file != NULL );
    assert( (bfile->flags & BF_WRITABLE) != FALSE );

    towrite = bfile->pos - bfile->ipos;
    written = 0;
    while ( written < towrite ) {
        size_t res, bufpos;
        bufpos = bfile->ipos % bfile->buffer_size;
        res = fwrite( bfile->buffer + bufpos + written, 1, 
                      towrite - written, bfile->file );
        if ( res != 0 ) {
            written += res;
        } else {
            fprintf( stderr, "Error: fwrite() returned 0.\n" );
        }
    }

    bfile->ipos += written;
}